

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O0

void zt_mem_pools_display(int offset,int flags)

{
  int in_EDI;
  zt_mem_pool *pool;
  zt_elist_t *tmp;
  int in_stack_000002a4;
  zt_mem_pool *in_stack_000002a8;
  int in_stack_000002b4;
  zt_elist_t *local_10;
  
  printf("%*sPools { \n",(ulong)(uint)(in_EDI * 5),"");
  for (local_10 = pools.next; local_10 != &pools; local_10 = local_10->next) {
    zt_mem_pool_display(in_stack_000002b4,in_stack_000002a8,in_stack_000002a4);
  }
  printf("%*s}\n",(ulong)(uint)(in_EDI * 5),"");
  return;
}

Assistant:

void
zt_mem_pools_display(int offset, int flags)
{
    zt_elist_t  * tmp;
    zt_mem_pool * pool;

    printf(BLANK "Pools { \n", INDENT(offset));
    zt_elist_for_each(&pools, tmp) {
        pool = zt_elist_data(tmp, zt_mem_pool, pool_list);
        zt_mem_pool_display(offset + 1, pool, flags);
    }
    printf(BLANK "}\n", INDENT(offset));
}